

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O2

TermList Lib::List<Kernel::TermList>::pop(List<Kernel::TermList> **lst)

{
  List<Kernel::TermList> *ptr;
  uint64_t uVar1;
  List<Kernel::TermList> *pLVar2;
  
  ptr = *lst;
  uVar1 = (ptr->_head)._content;
  pLVar2 = ptr->_tail;
  operator_delete(ptr,0x10);
  *lst = pLVar2;
  return (TermList)uVar1;
}

Assistant:

static C pop(List* &lst)
  {
    ASS_NEQ(lst,0);

    List* tail = lst->tail();
    C result = lst->head();
    delete lst;
    lst = tail;

    return result;
  }